

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O1

void aom_dc_predictor_32x64_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  int iVar6;
  uint8_t uVar7;
  undefined1 auVar8 [32];
  
  auVar8 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  auVar5 = vpsadbw_avx2(auVar8,*(undefined1 (*) [32])above);
  auVar1 = vpaddq_avx(auVar5._16_16_,auVar5._0_16_);
  auVar5 = vpsadbw_avx2(auVar8,*(undefined1 (*) [32])left);
  auVar8 = vpsadbw_avx2(auVar8,*(undefined1 (*) [32])(left + 0x20));
  auVar3 = vpshufd_avx(auVar1,0xee);
  auVar5 = vpaddq_avx2(auVar8,auVar5);
  auVar2 = vpaddq_avx(auVar5._16_16_,auVar5._0_16_);
  auVar4 = vpshufd_avx(auVar2,0xee);
  auVar1 = vpaddw_avx(auVar3,auVar1);
  auVar1 = vpaddw_avx(auVar1,auVar2);
  auVar1 = vpaddw_avx(auVar1,auVar4);
  uVar7 = (uint8_t)((auVar1._0_4_ + 0x30U & 0xffe0) / 0x60);
  iVar6 = 0x40;
  do {
    *dst = uVar7;
    dst[1] = uVar7;
    dst[2] = uVar7;
    dst[3] = uVar7;
    dst[4] = uVar7;
    dst[5] = uVar7;
    dst[6] = uVar7;
    dst[7] = uVar7;
    dst[8] = uVar7;
    dst[9] = uVar7;
    dst[10] = uVar7;
    dst[0xb] = uVar7;
    dst[0xc] = uVar7;
    dst[0xd] = uVar7;
    dst[0xe] = uVar7;
    dst[0xf] = uVar7;
    dst[0x10] = uVar7;
    dst[0x11] = uVar7;
    dst[0x12] = uVar7;
    dst[0x13] = uVar7;
    dst[0x14] = uVar7;
    dst[0x15] = uVar7;
    dst[0x16] = uVar7;
    dst[0x17] = uVar7;
    dst[0x18] = uVar7;
    dst[0x19] = uVar7;
    dst[0x1a] = uVar7;
    dst[0x1b] = uVar7;
    dst[0x1c] = uVar7;
    dst[0x1d] = uVar7;
    dst[0x1e] = uVar7;
    dst[0x1f] = uVar7;
    dst = dst + stride;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  return;
}

Assistant:

void aom_dc_predictor_32x64_avx2(uint8_t *dst, ptrdiff_t stride,
                                 const uint8_t *above, const uint8_t *left) {
  const __m256i sum_above = dc_sum_32(above);
  __m256i sum_left = dc_sum_64(left);
  sum_left = _mm256_add_epi16(sum_left, sum_above);
  uint16_t sum = (uint16_t)_mm_cvtsi128_si32(_mm256_castsi256_si128(sum_left));
  sum += 48;
  sum /= 96;
  const __m256i row = _mm256_set1_epi8((int8_t)sum);
  row_store_32xh(&row, 64, dst, stride);
}